

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O3

Aig_Tsi_t * Aig_TsiStart(Aig_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  Aig_Tsi_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Aig_MmFixed_t *pAVar6;
  uint **ppuVar7;
  uint uVar8;
  int iVar9;
  
  pAVar3 = (Aig_Tsi_t *)calloc(1,0x30);
  pAVar3->pAig = pAig;
  iVar9 = ((pAig->nRegs >> 4) + 1) - (uint)((pAig->nRegs & 0xfU) == 0);
  pAVar3->nWords = iVar9;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  pVVar4->pArray = ppvVar5;
  pAVar3->vStates = pVVar4;
  pAVar6 = Aig_MmFixedStart(iVar9 * 4 + 8,10000);
  pAVar3->pMem = pAVar6;
  uVar8 = 499;
  while( true ) {
    do {
      uVar1 = uVar8 + 1;
      uVar2 = uVar8 & 1;
      uVar8 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar9 = 5;
    while (uVar1 % (iVar9 - 2U) != 0) {
      uVar2 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar1 < uVar2) goto LAB_006d530b;
    }
  }
LAB_006d530b:
  pAVar3->nBins = uVar1;
  ppuVar7 = (uint **)calloc(1,(long)(int)uVar1 << 3);
  pAVar3->pBins = ppuVar7;
  return pAVar3;
}

Assistant:

Aig_Tsi_t * Aig_TsiStart( Aig_Man_t * pAig )
{
    Aig_Tsi_t * p;
    p = ABC_ALLOC( Aig_Tsi_t, 1 );
    memset( p, 0, sizeof(Aig_Tsi_t) );
    p->pAig    = pAig;
    p->nWords  = Abc_BitWordNum( 2*Aig_ManRegNum(pAig) );
    p->vStates = Vec_PtrAlloc( 1000 );
    p->pMem    = Aig_MmFixedStart( sizeof(unsigned) * p->nWords + sizeof(unsigned *), 10000 );
    p->nBins   = Abc_PrimeCudd(TSI_MAX_ROUNDS/2);
    p->pBins   = ABC_ALLOC( unsigned *, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned *) * p->nBins );
    return p;
}